

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdateForRootNode(ImGuiDockNode *node)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiDockNode *local_40;
  int local_34;
  int n;
  ImGuiDockNode *first_node_with_windows;
  ImGuiDockNodeFindInfoResults results;
  ImGuiDockNode *node_local;
  
  results._16_8_ = node;
  DockNodeUpdateVisibleFlagAndInactiveChilds(node);
  ImGuiDockNodeFindInfoResults::ImGuiDockNodeFindInfoResults
            ((ImGuiDockNodeFindInfoResults *)&first_node_with_windows);
  DockNodeFindInfo((ImGuiDockNode *)results._16_8_,
                   (ImGuiDockNodeFindInfoResults *)&first_node_with_windows);
  *(ImGuiDockNode **)(results._16_8_ + 0x90) = first_node_with_windows;
  if ((int)results.FirstNodeWithWindows == 1) {
    local_40 = results.CentralNode;
  }
  else {
    local_40 = (ImGuiDockNode *)0x0;
  }
  *(ImGuiDockNode **)(results._16_8_ + 0x98) = local_40;
  if ((*(int *)(results._16_8_ + 0xac) == 0) && (results.CentralNode != (ImGuiDockNode *)0x0)) {
    *(ImGuiID *)(results._16_8_ + 0xac) = (results.CentralNode)->ID;
  }
  if (results.CentralNode != (ImGuiDockNode *)0x0) {
    ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(results.CentralNode)->Windows,0);
    pIVar1 = *ppIVar2;
    *(undefined8 *)(results._16_8_ + 0x5c) = *(undefined8 *)&pIVar1->WindowClass;
    *(undefined8 *)(results._16_8_ + 100) =
         *(undefined8 *)&(pIVar1->WindowClass).ViewportFlagsOverrideSet;
    *(undefined8 *)(results._16_8_ + 0x6c) =
         *(undefined8 *)&(pIVar1->WindowClass).DockNodeFlagsOverrideSet;
    *(undefined2 *)(results._16_8_ + 0x74) =
         *(undefined2 *)&(pIVar1->WindowClass).DockingAlwaysTabBar;
    for (local_34 = 1; local_34 < ((results.CentralNode)->Windows).Size; local_34 = local_34 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(results.CentralNode)->Windows,local_34);
      if ((((*ppIVar2)->WindowClass).DockingAllowUnclassed & 1U) == 0) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(results.CentralNode)->Windows,local_34);
        pIVar1 = *ppIVar2;
        *(undefined8 *)(results._16_8_ + 0x5c) = *(undefined8 *)&pIVar1->WindowClass;
        *(undefined8 *)(results._16_8_ + 100) =
             *(undefined8 *)&(pIVar1->WindowClass).ViewportFlagsOverrideSet;
        *(undefined8 *)(results._16_8_ + 0x6c) =
             *(undefined8 *)&(pIVar1->WindowClass).DockNodeFlagsOverrideSet;
        *(undefined2 *)(results._16_8_ + 0x74) =
             *(undefined2 *)&(pIVar1->WindowClass).DockingAlwaysTabBar;
        return;
      }
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdateForRootNode(ImGuiDockNode* node)
{
    DockNodeUpdateVisibleFlagAndInactiveChilds(node);

    // FIXME-DOCK: Merge this scan into the one above.
    // - Setup central node pointers
    // - Find if there's only a single visible window in the hierarchy (in which case we need to display a regular title bar -> FIXME-DOCK: that last part is not done yet!)
    ImGuiDockNodeFindInfoResults results;
    DockNodeFindInfo(node, &results);
    node->CentralNode = results.CentralNode;
    node->OnlyNodeWithWindows = (results.CountNodesWithWindows == 1) ? results.FirstNodeWithWindows : NULL;
    if (node->LastFocusedNodeId == 0 && results.FirstNodeWithWindows != NULL)
        node->LastFocusedNodeId = results.FirstNodeWithWindows->ID;

    // Copy the window class from of our first window so it can be used for proper dock filtering.
    // When node has mixed windows, prioritize the class with the most constraint (DockingAllowUnclassed = false) as the reference to copy.
    // FIXME-DOCK: We don't recurse properly, this code could be reworked to work from DockNodeUpdateScanRec.
    if (ImGuiDockNode* first_node_with_windows = results.FirstNodeWithWindows)
    {
        node->WindowClass = first_node_with_windows->Windows[0]->WindowClass;
        for (int n = 1; n < first_node_with_windows->Windows.Size; n++)
            if (first_node_with_windows->Windows[n]->WindowClass.DockingAllowUnclassed == false)
            {
                node->WindowClass = first_node_with_windows->Windows[n]->WindowClass;
                break;
            }
    }
}